

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O2

void __thiscall
s2coding::EncodeUintVector<unsigned_int>(s2coding *this,Span<const_unsigned_int> v,Encoder *encoder)

{
  uint uVar1;
  long lVar2;
  Encoder *this_00;
  pointer puVar3;
  uint uVar4;
  
  this_00 = (Encoder *)v.len_;
  puVar3 = v.ptr_;
  uVar1 = 1;
  for (lVar2 = 0; (long)puVar3 * 4 - lVar2 != 0; lVar2 = lVar2 + 4) {
    uVar1 = uVar1 | *(uint *)(this + lVar2);
  }
  uVar4 = 0x1f;
  if (uVar1 != 0) {
    for (; uVar1 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar1 = (uVar4 ^ 0x18) >> 3;
  uVar4 = 4 - uVar1;
  Encoder::Ensure(this_00,(ulong)uVar4 * (long)puVar3 + 10);
  Encoder::put_varint64(this_00,(long)puVar3 * 4 + (ulong)(uVar1 ^ 3));
  for (lVar2 = 0; (long)puVar3 * 4 - lVar2 != 0; lVar2 = lVar2 + 4) {
    EncodeUintWithLength<unsigned_int>(*(uint *)(this + lVar2),uVar4,this_00);
  }
  return;
}

Assistant:

void EncodeUintVector(absl::Span<const T> v, Encoder* encoder) {
  // The encoding is as follows:
  //
  //   varint64: (v.size() * sizeof(T)) | (len - 1)
  //   array of v.size() elements ["len" bytes each]
  //
  // Note that we don't allow (len == 0) since this would require an extra bit
  // to encode the length.

  T one_bits = 1;  // Ensures len >= 1.
  for (auto x : v) one_bits |= x;
  int len = (Bits::FindMSBSetNonZero64(one_bits) >> 3) + 1;
  S2_DCHECK(len >= 1 && len <= 8);

  // Note that the multiplication is optimized into a bit shift.
  encoder->Ensure(Varint::kMax64 + v.size() * len);
  uint64 size_len = (uint64{v.size()} * sizeof(T)) | (len - 1);
  encoder->put_varint64(size_len);
  for (auto x : v) {
    EncodeUintWithLength(x, len, encoder);
  }
}